

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O0

size_t mspace_set_footprint_limit(mspace msp,size_t bytes)

{
  mstate ms;
  size_t result;
  size_t bytes_local;
  mspace msp_local;
  
  if (bytes == 0xffffffffffffffff) {
    ms = (mstate)0x0;
  }
  else {
    ms = (mstate)(bytes + (mparams.granularity - 1) & (mparams.granularity - 1 ^ 0xffffffffffffffff)
                 );
  }
  *(mstate *)((long)msp + 0x368) = ms;
  return (size_t)ms;
}

Assistant:

size_t mspace_set_footprint_limit(mspace msp, size_t bytes) {
  size_t result = 0;
  mstate ms = (mstate)msp;
  if (ok_magic(ms)) {
    if (bytes == 0)
      result = granularity_align(1); /* Use minimal size */
    if (bytes == MAX_SIZE_T)
      result = 0;                    /* disable */
    else
      result = granularity_align(bytes);
    ms->footprint_limit = result;
  }
  else {
    USAGE_ERROR_ACTION(ms,ms);
  }
  return result;
}